

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

void __thiscall glslang::HlslGrammar::acceptAttributes(HlslGrammar *this,TAttributes *attributes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TAttributeType TVar5;
  TIntermAggregate *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t s;
  char *syntax;
  TIntermTyped *node;
  HlslToken attributeToken;
  TString nameSpace;
  value_type local_a0;
  TIntermNode *local_90;
  HlslToken local_88;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  while( true ) {
    local_88.field_2.string =
         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
    local_88.loc.name = (TString *)0x0;
    local_88.loc.string = 0;
    local_88.loc.line = 0;
    local_88.loc.column = 0;
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    if (!bVar1) {
      return;
    }
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    bVar2 = acceptIdentifier(this,&local_88);
    if ((!bVar2) &&
       (bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
       !bVar2)) {
      expected(this,"namespace or attribute identifier");
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    }
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&local_58,local_88.field_2.string);
      bVar2 = acceptIdentifier(this,&local_88);
      if (!bVar2) {
        syntax = "attribute identifier";
        goto LAB_003a6917;
      }
    }
    s = 0x163;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (bVar2) {
      this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,s);
      TIntermAggregate::TIntermAggregate(this_00);
      bVar2 = false;
      while (bVar3 = acceptAssignmentExpression(this,(TIntermTyped **)&local_a0), bVar3) {
        iVar4 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(this_00);
        local_90 = (TIntermNode *)CONCAT44(local_a0._4_4_,local_a0.name);
        std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                  ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   CONCAT44(extraout_var,iVar4),&local_90);
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (!bVar3) {
        expected(this,")");
      }
      if ((bVar2 != false) ||
         (iVar4 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_00),
         *(long *)(CONCAT44(extraout_var_00,iVar4) + 8) ==
         *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x10))) {
        expected(this,"expression");
      }
    }
    else {
      this_00 = (TIntermAggregate *)0x0;
    }
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
    if (!bVar2) break;
    if ((bVar1) &&
       (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
       !bVar1)) {
      syntax = "]]";
      goto LAB_003a6917;
    }
    if (local_88.field_2.string != (TString *)0x0) {
      TVar5 = HlslParseContext::attributeFromName
                        (this->parseContext,&local_58,local_88.field_2.string);
      if (TVar5 == EatNone) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2e])(this->parseContext,&local_88,"unrecognized attribute",
                  ((local_88.field_2.string)->_M_dataplus)._M_p,"");
      }
      else {
        local_a0.name = TVar5;
        local_a0.args = this_00;
        std::__cxx11::
        list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::push_back
                  (&attributes->
                    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   ,&local_a0);
      }
    }
  }
  syntax = "]";
LAB_003a6917:
  expected(this,syntax);
  return;
}

Assistant:

void HlslGrammar::acceptAttributes(TAttributes& attributes)
{
    // For now, accept the [ XXX(X) ] syntax, but drop all but
    // numthreads, which is used to set the CS local size.
    // TODO: subset to correct set?  Pass on?
    do {
        HlslToken attributeToken;

        // LEFT_BRACKET?
        if (! acceptTokenClass(EHTokLeftBracket))
            return;
        // another LEFT_BRACKET?
        bool doubleBrackets = false;
        if (acceptTokenClass(EHTokLeftBracket))
            doubleBrackets = true;

        // attribute? (could be namespace; will adjust later)
        if (!acceptIdentifier(attributeToken)) {
            if (!peekTokenClass(EHTokRightBracket)) {
                expected("namespace or attribute identifier");
                advanceToken();
            }
        }

        TString nameSpace;
        if (acceptTokenClass(EHTokColonColon)) {
            // namespace COLON COLON
            nameSpace = *attributeToken.string;
            // attribute
            if (!acceptIdentifier(attributeToken)) {
                expected("attribute identifier");
                return;
            }
        }

        TIntermAggregate* expressions = nullptr;

        // (x, ...)
        if (acceptTokenClass(EHTokLeftParen)) {
            expressions = new TIntermAggregate;

            TIntermTyped* node;
            bool expectingExpression = false;

            while (acceptAssignmentExpression(node)) {
                expectingExpression = false;
                expressions->getSequence().push_back(node);
                if (acceptTokenClass(EHTokComma))
                    expectingExpression = true;
            }

            // 'expressions' is an aggregate with the expressions in it
            if (! acceptTokenClass(EHTokRightParen))
                expected(")");

            // Error for partial or missing expression
            if (expectingExpression || expressions->getSequence().empty())
                expected("expression");
        }

        // RIGHT_BRACKET
        if (!acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }
        // another RIGHT_BRACKET?
        if (doubleBrackets && !acceptTokenClass(EHTokRightBracket)) {
            expected("]]");
            return;
        }

        // Add any values we found into the attribute map.
        if (attributeToken.string != nullptr) {
            TAttributeType attributeType = parseContext.attributeFromName(nameSpace, *attributeToken.string);
            if (attributeType == EatNone)
                parseContext.warn(attributeToken.loc, "unrecognized attribute", attributeToken.string->c_str(), "");
            else {
                TAttributeArgs attributeArgs = { attributeType, expressions };
                attributes.push_back(attributeArgs);
            }
        }
    } while (true);
}